

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
 __thiscall
kj::
Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
          (Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
           *this,SchemaBindingsPair *params)

{
  uint64_t *puVar1;
  int iVar2;
  RawSchema *pRVar3;
  uint uVar4;
  RawSchema **in_RDX;
  uint uVar5;
  int in_R8D;
  uint64_t *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar6;
  
  puVar7 = (uint64_t *)0x0;
  if (params[3].scopeBindings != (Scope *)0x0) {
    pRVar3 = params->schema;
    uVar4 = hashCode<capnp::_::RawSchema_const*const&,capnp::_::RawBrandedSchema::Scope_const*const&>
                      (in_RDX,(Scope **)(in_RDX + 1));
    uVar5 = (int)params[3].scopeBindings - 1U & uVar4;
    while( true ) {
      uVar6 = (ulong)uVar5;
      iVar2 = *(int *)((long)&(params[3].schema)->id + uVar6 * 8 + 4);
      if (iVar2 == 0) break;
      if ((iVar2 != 1) && ((uint)(&(params[3].schema)->id)[uVar6] == uVar4)) {
        puVar1 = &pRVar3->id + (ulong)(iVar2 - 2) * 3;
        auVar8._0_4_ = -(uint)((int)*puVar1 == *(int *)in_RDX);
        auVar8._4_4_ = -(uint)(*(int *)((long)puVar1 + 4) == *(int *)((long)in_RDX + 4));
        auVar8._8_4_ = -(uint)(*(int *)(puVar1 + 1) == *(int *)(in_RDX + 1));
        auVar8._12_4_ = -(uint)(*(int *)((long)puVar1 + 0xc) == *(int *)((long)in_RDX + 0xc));
        auVar9._4_4_ = auVar8._0_4_;
        auVar9._0_4_ = auVar8._4_4_;
        auVar9._8_4_ = auVar8._12_4_;
        auVar9._12_4_ = auVar8._8_4_;
        in_R8D = movmskpd(in_R8D,auVar9 & auVar8);
        if (in_R8D == 3) {
          puVar7 = &params->schema->id + (ulong)(iVar2 - 2) * 3;
          break;
        }
      }
      uVar5 = (uint)(Scope *)(uVar6 + 1);
      if ((Scope *)(uVar6 + 1) == params[3].scopeBindings) {
        uVar5 = 0;
      }
    }
  }
  *(uint64_t **)this = puVar7;
  return (Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
          )(Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}